

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

char * mkvparser::SafeArrayAlloc<char>
                 (unsigned_long_long num_elements,unsigned_long_long element_size)

{
  undefined1 auVar1 [16];
  ulong in_RSI;
  ulong in_RDI;
  unsigned_long_long num_bytes;
  size_t kMaxAllocSize;
  char *local_8;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_8 = (char *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80000000)) / auVar1,0) < in_RSI) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)operator_new__(in_RDI * in_RSI,(nothrow_t *)&std::nothrow);
    }
  }
  return local_8;
}

Assistant:

Type* SafeArrayAlloc(unsigned long long num_elements,
                     unsigned long long element_size) {
  if (num_elements == 0 || element_size == 0)
    return NULL;

  const size_t kMaxAllocSize = 0x80000000;  // 2GiB
  const unsigned long long num_bytes = num_elements * element_size;
  if (element_size > (kMaxAllocSize / num_elements))
    return NULL;
  if (num_bytes != static_cast<size_t>(num_bytes))
    return NULL;

  return new (std::nothrow) Type[static_cast<size_t>(num_bytes)];
}